

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall CVmFormatterLog::set_log_file(CVmFormatterLog *this,CVmNetFile *nf,osfildef *fp)

{
  int iVar1;
  
  iVar1 = close_log_file(this);
  if (iVar1 == 0) {
    (*(this->super_CVmFormatter)._vptr_CVmFormatter[1])(this);
    this->logfp_ = fp;
    this->lognf_ = nf;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int CVmFormatterLog::set_log_file(VMG_ CVmNetFile *nf, osfildef *fp)
{
    /* close any existing log file */
    if (close_log_file(vmg0_))
        return 1;

    /* reinitialize */
    init();

    /* remember the file */
    logfp_ = fp;
    lognf_ = nf;

    /* success */
    return 0;
}